

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int float128_le_quiet_m68k(float128 a,float128 b,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  uVar3 = a.high;
  uVar4 = a.low;
  uVar1 = b.high;
  uVar2 = b.low;
  if ((((~uVar3 & 0x7fff000000000000) == 0) &&
      (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       uVar4 != 0)) ||
     (((~uVar1 & 0x7fff000000000000) == 0 &&
      (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       uVar2 != 0)))) {
    if ((((uVar3 & 0x7fff800000000000) == 0x7fff000000000000) &&
        (((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
         uVar4 != 0)) ||
       ((bVar5 = false, (uVar1 & 0x7fff800000000000) == 0x7fff000000000000 &&
        (((undefined1  [16])b & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
         uVar2 != 0)))) {
      status->float_exception_flags = status->float_exception_flags | 1;
      bVar5 = false;
    }
  }
  else if ((long)(uVar1 ^ uVar3) < 0) {
    if ((long)uVar3 < 0) {
      bVar5 = true;
    }
    else {
      bVar5 = (((uVar1 | uVar3) & 0x7fffffffffffffff) == 0 && uVar4 == 0) && uVar2 == 0;
    }
  }
  else {
    if ((long)uVar3 < 0) {
      bVar5 = uVar1 < uVar3;
      bVar6 = uVar2 < uVar4;
    }
    else {
      bVar5 = uVar3 < uVar1;
      bVar6 = uVar4 < uVar2;
    }
    bVar5 = (bool)(((bVar6 || uVar4 == uVar2) && uVar3 == uVar1) | bVar5);
  }
  return (int)bVar5;
}

Assistant:

int float128_le_quiet(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign;

    if (    (    ( extractFloat128Exp( a ) == 0x7FFF )
              && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) )
         || (    ( extractFloat128Exp( b ) == 0x7FFF )
              && ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )
       ) {
        if (float128_is_signaling_nan(a, status)
         || float128_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    aSign = extractFloat128Sign( a );
    bSign = extractFloat128Sign( b );
    if ( aSign != bSign ) {
        return
               aSign
            || (    ( ( (uint64_t) ( ( a.high | b.high )<<1 ) ) | a.low | b.low )
                 == 0 );
    }
    return
          aSign ? le128( b.high, b.low, a.high, a.low )
        : le128( a.high, a.low, b.high, b.low );

}